

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::PushPopFrameHelper::~PushPopFrameHelper(PushPopFrameHelper *this)

{
  code *pcVar1;
  bool bVar2;
  InterpreterStackFrame *pIVar3;
  undefined4 *puVar4;
  
  if (this->m_isHiddenFrame == false) {
    pIVar3 = ThreadContext::PopInterpreterFrame(this->m_threadContext);
    if (pIVar3 != this->m_interpreterFrame) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/InterpreterStackFrame.h"
                                  ,0x36d,"(interpreterFrame == m_interpreterFrame)",
                                  "Interpreter frame chain corrupted?");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

~ PushPopFrameHelper()
            {
                if (!m_isHiddenFrame)
                {
                    Js::InterpreterStackFrame *interpreterFrame = m_threadContext->PopInterpreterFrame();
                    AssertMsg(interpreterFrame == m_interpreterFrame,
                        "Interpreter frame chain corrupted?");
                }
            }